

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::PromoteObjectSynchData
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,VOID *pvLocalSynchData,
          VOID **ppvSharedSynchData)

{
  uint n;
  CObjectType *pCVar1;
  OwnedObjectsListNode *pOVar2;
  _WaitingThreadsListNode *p_Var3;
  uint uVar4;
  LONG lSignalCount;
  VOID *shmptr;
  CSynchData *this_00;
  LPVOID pvVar5;
  long lVar6;
  MonitoredProcessesListNode *pMVar7;
  undefined4 uVar8;
  int iVar9;
  _WaitingThreadsListNode *pobj;
  ulong cElements;
  long *plVar10;
  int iVar11;
  PAL_ERROR PVar12;
  unsigned_long *local_50;
  
  if (pthrCurrent == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7c);
    fprintf(_stderr,"Expression: NULL != pthrCurrent\n");
  }
  if (pvLocalSynchData == (VOID *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7d);
    fprintf(_stderr,"Expression: NULL != pvLocalSynchData\n");
  }
  if (ppvSharedSynchData == (VOID **)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7e);
    fprintf(_stderr,"Expression: NULL != ppvSharedSynchData\n");
  }
  if (*(int *)((long)pvLocalSynchData + 0x20) != 0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7f);
    fprintf(_stderr,"Expression: ProcessLocalObject == psdLocal->GetObjectDomain()\n");
  }
  shmptr = (VOID *)CSHRSynchCache<CorUnix::CSynchData>::Get(&this->m_cacheSHRSynchData,pthrCurrent);
  if (shmptr == (VOID *)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      return 8;
    }
    abort();
  }
  this_00 = (CSynchData *)SHMPtrToPtr((SHMPTR)shmptr);
  if (this_00 == (CSynchData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd95);
    fprintf(_stderr,"Expression: NULL != psdShared\n");
  }
  n = *(uint *)((long)pvLocalSynchData + 0x10);
  cElements = (ulong)n;
  if (cElements == 0) {
    local_50 = (unsigned_long *)0x0;
  }
  else {
    local_50 = InternalNewArray<unsigned_long>(cElements);
    if (local_50 == (unsigned_long *)0x0) {
      return 0xe;
    }
    uVar4 = CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Get
                      (&this->m_cacheSHRWTListNodes,pthrCurrent,n,local_50);
    if (uVar4 != n) {
      PVar12 = 0xe;
      while (uVar4 = uVar4 - 1, -1 < (int)uVar4) {
        CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                  (&this->m_cacheSHRWTListNodes,pthrCurrent,local_50[uVar4 & 0x7fffffff]);
      }
      goto LAB_0033ce4a;
    }
  }
  pCVar1 = CObjectType::s_rgotIdMapping[*(uint *)((long)pvLocalSynchData + 0x24)];
  if (pCVar1 == (CObjectType *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xdc0);
    fprintf(_stderr,"Expression: NULL != pot\n");
  }
  if (pCVar1->m_eTypeId == otiProcess) {
    InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  }
  this_00->m_shridThis = (SHMPTR)shmptr;
  this_00->m_odObjectDomain = SharedObject;
  this_00->m_otiObjectTypeId =
       CObjectType::s_rgotIdMapping[*(uint *)((long)pvLocalSynchData + 0x24)]->m_eTypeId;
  lSignalCount = CSynchData::GetSignalCount((CSynchData *)pvLocalSynchData);
  CSynchData::SetSignalCount(this_00,lSignalCount);
  (this_00->m_ptrWTLHead).shrid = 0;
  (this_00->m_ptrWTLTail).shrid = 0;
  if (cElements != 0) {
    iVar11 = 0;
    plVar10 = (long *)pvLocalSynchData;
    while (lVar6 = *plVar10, lVar6 != 0) {
      pvVar5 = SHMPtrToPtr(local_50[iVar11]);
      if (pvVar5 == (LPVOID)0x0) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xded);
        fprintf(_stderr,"Expression: NULL != pwtlnNew\n");
      }
      *(unsigned_long *)((long)pvVar5 + 0x10) = local_50[iVar11];
      *(VOID **)((long)pvVar5 + 0x30) = shmptr;
      *(undefined8 *)((long)pvVar5 + 0x18) = *(undefined8 *)(lVar6 + 0x18);
      *(undefined4 *)((long)pvVar5 + 0x20) = *(undefined4 *)(lVar6 + 0x20);
      *(uint *)((long)pvVar5 + 0x24) = *(uint *)(lVar6 + 0x24) | 1;
      *(undefined8 *)((long)pvVar5 + 0x28) = *(undefined8 *)(lVar6 + 0x28);
      *(undefined8 *)((long)pvVar5 + 0x38) = *(undefined8 *)(lVar6 + 0x38);
      CSynchData::SharedWaiterEnqueue(this_00,local_50[iVar11]);
      LOCK();
      this_00->m_lRefCount = this_00->m_lRefCount + 1;
      UNLOCK();
      plVar10 = *(long **)(*(long *)(lVar6 + 0x38) + 0x18 + (ulong)*(uint *)(lVar6 + 0x20) * 8);
      if (plVar10 == (long *)0x0) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xdfc);
        fprintf(_stderr,
                "Expression: pwtlnOld = pwtlnOld->ptwiWaitInfo->rgpWTLNodes[pwtlnOld->dwObjIndex]\n"
               );
      }
      *(LPVOID *)(*(long *)((long)pvVar5 + 0x38) + 0x18 + (ulong)*(uint *)((long)pvVar5 + 0x20) * 8)
           = pvVar5;
      lVar6 = *(long *)((long)pvVar5 + 0x38);
      iVar9 = *(int *)(lVar6 + 0xc) + 1;
      *(int *)(lVar6 + 0xc) = iVar9;
      if (iVar9 == *(int *)(lVar6 + 8)) {
        uVar8 = 2;
      }
      else {
        uVar8 = 1;
        if (*(int *)(lVar6 + 8) <= iVar9) {
          fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0xe08);
          fprintf(_stderr,
                  "Expression: pwtlnNew->ptwiWaitInfo->lSharedObjCount < pwtlnNew->ptwiWaitInfo->lObjCount\n"
                 );
          lVar6 = *(long *)((long)pvVar5 + 0x38);
          uVar8 = 1;
        }
      }
      *(undefined4 *)(lVar6 + 4) = uVar8;
      iVar11 = iVar11 + 1;
    }
    if (this_00->m_ulcWaitingThreads != n) {
      fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0xe0e);
      fprintf(_stderr,"Expression: psdShared->GetWaitingThreadCount() == ulcWaitingThreads\n");
    }
  }
  if (pCVar1->m_eOwnershipSemantics == OwnershipTracked) {
    pOVar2 = *(OwnedObjectsListNode **)((long)pvLocalSynchData + 0x48);
    if (pOVar2 == (OwnedObjectsListNode *)0x0) {
      if (*(int *)((long)pvLocalSynchData + 0x30) != 0) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xe2c);
        fprintf(_stderr,"Expression: 0 == psdLocal->GetOwnershipCount()\n");
      }
      if (this_00->m_lOwnershipCount != 0) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xe2d);
        fprintf(_stderr,"Expression: 0 == psdShared->GetOwnershipCount()\n");
      }
      this_00->m_fAbandoned = *(bool *)((long)pvLocalSynchData + 0x50);
    }
    else {
      pOVar2->pPalObjSynchData = this_00;
      this_00->m_poolnOwnedObjectListNode = pOVar2;
      LOCK();
      this_00->m_lRefCount = this_00->m_lRefCount + 1;
      UNLOCK();
      CSynchData::SetOwner(this_00,*(CPalThread **)((long)pvLocalSynchData + 0x40));
      this_00->m_lOwnershipCount = *(LONG *)((long)pvLocalSynchData + 0x30);
      if (this_00->m_fAbandoned == true) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xe28);
        fprintf(_stderr,"Expression: !psdShared->IsAbandoned()\n");
      }
    }
  }
  if (pCVar1->m_eTypeId == otiProcess) {
    pMVar7 = (MonitoredProcessesListNode *)&this->m_pmplnMonitoredProcesses;
    while (pMVar7 = pMVar7->pNext, pMVar7 != (MonitoredProcessesListNode *)0x0) {
      if (pMVar7->psdSynchData == (CSynchData *)pvLocalSynchData) {
        pMVar7->psdSynchData = this_00;
        LOCK();
        this_00->m_lRefCount = this_00->m_lRefCount + 1;
        UNLOCK();
      }
    }
    pMVar7 = (MonitoredProcessesListNode *)&this->m_pmplnExitedNodes;
    while (pMVar7 = pMVar7->pNext, pMVar7 != (MonitoredProcessesListNode *)0x0) {
      if (pMVar7->psdSynchData == (CSynchData *)pvLocalSynchData) {
        pMVar7->psdSynchData = this_00;
        LOCK();
        this_00->m_lRefCount = this_00->m_lRefCount + 1;
        UNLOCK();
      }
    }
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  }
  *ppvSharedSynchData = shmptr;
  if (cElements != 0) {
    pobj = *pvLocalSynchData;
    while (pobj != (_WaitingThreadsListNode *)0x0) {
      p_Var3 = (pobj->ptrNext).ptr;
      CSynchCache<CorUnix::_WaitingThreadsListNode>::Add(&this->m_cacheWTListNodes,pthrCurrent,pobj)
      ;
      pobj = p_Var3;
    }
  }
  CSynchCache<CorUnix::CSynchData>::Add
            (&this->m_cacheSynchData,pthrCurrent,(CSynchData *)pvLocalSynchData);
  PVar12 = 0;
  if (local_50 == (unsigned_long *)0x0) {
    return 0;
  }
LAB_0033ce4a:
  InternalFree(local_50 + -1);
  return PVar12;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::PromoteObjectSynchData(
        CPalThread *pthrCurrent,
        VOID *pvLocalSynchData,
        VOID **ppvSharedSynchData)
    {
        PAL_ERROR palError = NO_ERROR;
        CSynchData *psdLocal = reinterpret_cast<CSynchData *>(pvLocalSynchData);
        CSynchData *psdShared = NULL;
        SharedID shridSynchData = NULLSharedID;
        SharedID *rgshridWTLNodes = NULL;
        CObjectType *pot = NULL;
        ULONG ulcWaitingThreads;

        _ASSERTE(NULL != pthrCurrent);
        _ASSERTE(NULL != pvLocalSynchData);
        _ASSERTE(NULL != ppvSharedSynchData);
        _ASSERTE(ProcessLocalObject == psdLocal->GetObjectDomain());

#if _DEBUG

        //
        // TODO: Verify that the proper locks are held
        //
#endif

        //
        // Allocate shared memory CSynchData and map to local memory
        //

        shridSynchData = m_cacheSHRSynchData.Get(pthrCurrent);
        if (NULLSharedID == shridSynchData)
        {
            ERROR("Unable to allocate shared memory\n");
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto POSD_exit;
        }

        psdShared = SharedIDToTypePointer(CSynchData, shridSynchData);
        _ASSERTE(NULL != psdShared);

        //
        // Allocate shared memory WaitingThreadListNodes if there are
        // any threads currently waiting on this object
        //

        ulcWaitingThreads = psdLocal->GetWaitingThreadCount();
        if (0 < ulcWaitingThreads)
        {
            int i;

            rgshridWTLNodes = InternalNewArray<SharedID>(ulcWaitingThreads);
            if (NULL == rgshridWTLNodes)
            {
                palError = ERROR_OUTOFMEMORY;
                goto POSD_exit;
            }

            i = m_cacheSHRWTListNodes.Get(
                    pthrCurrent,
                    ulcWaitingThreads,
                    rgshridWTLNodes
                    );

            if (static_cast<ULONG>(i) != ulcWaitingThreads)
            {
                for (i -= 1; i >= 0; i -= 1)
                {
                    m_cacheSHRWTListNodes.Add(pthrCurrent, rgshridWTLNodes[i]);
                }

                palError = ERROR_OUTOFMEMORY;
                goto POSD_exit;
            }
        }

        //
        // If the synch data is for a process object we need to grab
        // the monitored process list lock here
        //

        pot = psdLocal->GetObjectType();
        _ASSERTE(NULL != pot);

        if (otiProcess == pot->GetId())
        {
            InternalEnterCriticalSection(pthrCurrent, &s_csMonitoredProcessesLock);
        }

        //
        // Copy pertinent CSynchData info to the shared memory version (and
        // initialize other members)
        //

        psdShared->SetSharedThis(shridSynchData);
        psdShared->SetObjectDomain(SharedObject);
        psdShared->SetObjectType(psdLocal->GetObjectType());
        psdShared->SetSignalCount(psdLocal->GetSignalCount());

#ifdef SYNCH_STATISTICS
        psdShared->SetStatContentionCount(psdLocal->GetStatContentionCount());
        psdShared->SetStatWaitCount(psdLocal->GetStatWaitCount());
#endif

        //
        // Rebuild the waiting thread list, and update the wait domain
        // for the waiting threads
        //

        psdShared->SetWTLHeadShrPtr(NULLSharedID);
        psdShared->SetWTLTailShrPtr(NULLSharedID);

        if (0 < ulcWaitingThreads)
        {
            WaitingThreadsListNode *pwtlnOld;
            WaitingThreadsListNode *pwtlnNew;
            int i = 0;

            for (pwtlnOld = psdLocal->GetWTLHeadPtr();
                 pwtlnOld != NULL;
                 pwtlnOld = pwtlnOld->ptrNext.ptr, i += 1)
            {
                pwtlnNew = SharedIDToTypePointer(
                    WaitingThreadsListNode,
                    rgshridWTLNodes[i]
                    );

                _ASSERTE(NULL != pwtlnNew);

                pwtlnNew->shridSHRThis = rgshridWTLNodes[i];
                pwtlnNew->ptrOwnerObjSynchData.shrid = shridSynchData;

                pwtlnNew->dwThreadId = pwtlnOld->dwThreadId;
                pwtlnNew->dwProcessId = pwtlnOld->dwProcessId;
                pwtlnNew->dwObjIndex = pwtlnOld->dwObjIndex;
                pwtlnNew->dwFlags = pwtlnOld->dwFlags | WTLN_FLAG_OWNER_OBJECT_IS_SHARED;
                pwtlnNew->shridWaitingState = pwtlnOld->shridWaitingState;
                pwtlnNew->ptwiWaitInfo = pwtlnOld->ptwiWaitInfo;

                psdShared->SharedWaiterEnqueue(rgshridWTLNodes[i]);
                psdShared->AddRef();

                _ASSERTE(pwtlnOld = pwtlnOld->ptwiWaitInfo->rgpWTLNodes[pwtlnOld->dwObjIndex]);
                pwtlnNew->ptwiWaitInfo->rgpWTLNodes[pwtlnNew->dwObjIndex] = pwtlnNew;

                pwtlnNew->ptwiWaitInfo->lSharedObjCount += 1;
                if (pwtlnNew->ptwiWaitInfo->lSharedObjCount
                    == pwtlnNew->ptwiWaitInfo->lObjCount)
                {
                    pwtlnNew->ptwiWaitInfo->wdWaitDomain = SharedWait;
                }
                else
                {
                    _ASSERTE(pwtlnNew->ptwiWaitInfo->lSharedObjCount
                        < pwtlnNew->ptwiWaitInfo->lObjCount);

                    pwtlnNew->ptwiWaitInfo->wdWaitDomain = MixedWait;
                }
            }

            _ASSERTE(psdShared->GetWaitingThreadCount() == ulcWaitingThreads);
        }

        //
        // If the object tracks ownership and has a current owner update
        // the OwnedObjectsListNode to point to the shared memory synch
        // data
        //

        if (CObjectType::OwnershipTracked == pot->GetOwnershipSemantics())
        {
            OwnedObjectsListNode *pooln;

            pooln = psdLocal->GetOwnershipListNode();
            if (NULL != pooln)
            {
                pooln->pPalObjSynchData = psdShared;
                psdShared->SetOwnershipListNode(pooln);
                psdShared->AddRef();

                //
                // Copy over other ownership info.
                //

                psdShared->SetOwner(psdLocal->GetOwnerThread());
                psdShared->SetOwnershipCount(psdLocal->GetOwnershipCount());
                _ASSERTE(!psdShared->IsAbandoned());
            }
            else
            {
                _ASSERTE(0 == psdLocal->GetOwnershipCount());
                _ASSERTE(0 == psdShared->GetOwnershipCount());
                psdShared->SetAbandoned(psdLocal->IsAbandoned());
            }
        }

        //
        // If the synch data is for a process object update the monitored
        // process list nodes to point to the shared memory object data,
        // and release the monitored process list lock
        //

        if (otiProcess == pot->GetId())
        {
            MonitoredProcessesListNode *pmpn;

            pmpn = m_pmplnMonitoredProcesses;
            while (NULL != pmpn)
            {
                if (psdLocal == pmpn->psdSynchData)
                {
                    pmpn->psdSynchData = psdShared;
                    psdShared->AddRef();
                }

                pmpn = pmpn->pNext;
            }

            pmpn = m_pmplnExitedNodes;
            while (NULL != pmpn)
            {
                if (psdLocal == pmpn->psdSynchData)
                {
                    pmpn->psdSynchData = psdShared;
                    psdShared->AddRef();
                }

                pmpn = pmpn->pNext;
            }

            InternalLeaveCriticalSection(pthrCurrent, &s_csMonitoredProcessesLock);
        }

        *ppvSharedSynchData = reinterpret_cast<VOID*>(shridSynchData);

        //
        // Free the local memory items to caches
        //

        if (0 < ulcWaitingThreads)
        {
            WaitingThreadsListNode *pwtln;

            pwtln = psdLocal->GetWTLHeadPtr();
            while (NULL != pwtln)
            {
                WaitingThreadsListNode *pwtlnTemp;

                pwtlnTemp = pwtln;
                pwtln = pwtln->ptrNext.ptr;
                m_cacheWTListNodes.Add(pthrCurrent, pwtlnTemp);
            }
        }

        m_cacheSynchData.Add(pthrCurrent, psdLocal);

    POSD_exit:

        if (NULL != rgshridWTLNodes)
        {
            InternalDeleteArray(rgshridWTLNodes);
        }

        return palError;
    }